

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraCodeBlocksGenerator::CreateNewProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGlobalGenerator *pcVar2;
  pointer pcVar3;
  cmGeneratorTarget *pcVar4;
  cmSourceFile *this_00;
  iterator __position;
  size_type __n;
  pointer pbVar5;
  bool bVar6;
  TargetType TVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  cmSystemTools *this_01;
  _Base_ptr p_Var12;
  long *plVar13;
  ostream *poVar14;
  string *psVar15;
  char *__s2;
  undefined8 uVar16;
  vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *this_02;
  iterator iVar17;
  mapped_type *__x;
  mapped_type *this_03;
  _Rb_tree_node_base *p_Var18;
  size_type *psVar19;
  pointer ppcVar20;
  _Base_ptr p_Var21;
  pointer ppcVar22;
  cmExtraCodeBlocksGenerator *pcVar23;
  pointer pbVar24;
  cmMakefile *pcVar25;
  _Alloc_hider _Var26;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar27;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  string fastTarget;
  all_files_map_t allFiles;
  string compiler;
  string unitFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headerExts;
  string virtualFolders;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cFiles;
  string make;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcExts;
  Tree tree;
  cmGeneratedFileStream fout;
  string local_450;
  string local_430;
  undefined1 local_410 [32];
  _Rb_tree_node_base *local_3f0;
  size_t local_3e8;
  cmExtraCodeBlocksGenerator *local_3e0;
  allocator local_3d1;
  cmMakefile *local_3d0;
  undefined1 local_3c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  long local_378;
  string local_370;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_350;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  long *local_310 [2];
  long local_300 [2];
  pointer local_2f0;
  cmMakefile *local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e0;
  Tree local_2c8;
  undefined1 local_278 [584];
  
  pcVar25 = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(filename->_M_dataplus)._M_p,false);
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) == 0) {
    local_2c8.path._M_dataplus._M_p = (pointer)&local_2c8.path.field_2;
    local_2c8.path._M_string_length = 0;
    local_2c8.path.field_2._M_local_buf[0] = '\0';
    local_2c8.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2c8.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    p_Var12 = (pcVar2->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_3e0 = this;
    local_350 = lgs;
    if ((_Rb_tree_header *)p_Var12 != &(pcVar2->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
      local_3d0 = pcVar25;
      do {
        pcVar25 = local_3d0;
        local_3a8._M_allocated_capacity = 0;
        local_3a8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_398._M_allocated_capacity = 0;
        for (p_Var21 = *(_Base_ptr *)(p_Var12 + 2); p_Var21 != p_Var12[2]._M_parent;
            p_Var21 = (_Base_ptr)&p_Var21->_M_parent) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3a8
                     ,local_3a8._8_8_,*(undefined8 *)(*(long *)(*(long *)p_Var21 + 0x28) + 0x128),
                     *(undefined8 *)(*(long *)(*(long *)p_Var21 + 0x28) + 0x130));
        }
        local_410._0_8_ = local_410 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"CMAKE_ROOT","");
        pcVar9 = cmMakefile::GetDefinition(pcVar25,(string *)local_410);
        uVar16 = local_3a8._M_allocated_capacity;
        if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
          operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
          uVar16 = local_3a8._M_allocated_capacity;
        }
        for (; uVar16 != local_3a8._8_8_;
            uVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(uVar16 + 0x20)) {
          pcVar10 = (char *)strlen(pcVar9);
          lVar11 = std::__cxx11::string::find((char *)uVar16,(ulong)pcVar9,0);
          if (lVar11 != 0) {
            this_01 = (cmSystemTools *)
                      cmLocalGenerator::GetSourceDirectory
                                ((cmLocalGenerator *)**(undefined8 **)(p_Var12 + 2));
            cmSystemTools::RelativePath_abi_cxx11_
                      ((string *)local_410,this_01,*(char **)uVar16,pcVar10);
            local_3c8._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_3c8._8_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_3c8._16_8_ = (pointer)0x0;
            cmsys::SystemTools::SplitPath
                      ((string *)local_410,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3c8,false);
            pcVar3 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_3c8._8_8_ + -0x20))->_M_dataplus)._M_p;
            local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_370,pcVar3,
                       pcVar3 + ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_3c8._8_8_ + -0x20))->_M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_3c8._8_8_ + -0x20),(iterator)local_3c8._8_8_);
            if ((local_3c8._8_8_ != local_3c8._0_8_) &&
               (lVar11 = std::__cxx11::string::find((char *)local_410,0x59f43a,0), lVar11 == -1)) {
              Tree::InsertPath(&local_2c8,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_3c8,1,&local_370);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370._M_dataplus._M_p != &local_370.field_2) {
              operator_delete(local_370._M_dataplus._M_p,
                              CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                                       local_370.field_2._M_local_buf[0]) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_3c8);
            if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
              operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
            }
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_3a8);
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        pcVar25 = local_3d0;
      } while ((_Rb_tree_header *)p_Var12 !=
               &(((local_3e0->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->ProjectMap
                )._M_t._M_impl.super__Rb_tree_header);
    }
    pcVar23 = local_3e0;
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    local_370._M_string_length = 0;
    local_370.field_2._M_local_buf[0] = '\0';
    Tree::BuildVirtualFolder(&local_2c8,&local_370);
    pvVar27 = local_350;
    local_3a8._M_allocated_capacity = (size_type)&local_398;
    local_3a8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_398._M_allocated_capacity = local_398._M_allocated_capacity & 0xffffffffffffff00;
    pcVar9 = cmLocalGenerator::GetSourceDirectory
                       (*(local_350->
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::string((string *)local_3c8,pcVar9,(allocator *)local_310);
    plVar13 = (long *)std::__cxx11::string::append(local_3c8);
    pcVar9 = local_410 + 0x10;
    psVar19 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar19) {
      local_410._16_8_ = *psVar19;
      local_410._24_8_ = plVar13[3];
      local_410._0_8_ = pcVar9;
    }
    else {
      local_410._16_8_ = *psVar19;
      local_410._0_8_ = (size_type *)*plVar13;
    }
    local_410._8_8_ = plVar13[1];
    *plVar13 = (long)psVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    Tree::BuildUnit(&local_2c8,(string *)&local_3a8,(string *)local_410);
    if ((char *)local_410._0_8_ != pcVar9) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_3c8 + 0x10)) {
      operator_delete((void *)local_3c8._0_8_,(ulong)(local_3c8._16_8_ + 1));
    }
    GetCBCompilerId_abi_cxx11_((string *)local_3c8,pcVar23,pcVar25);
    local_410._0_8_ = pcVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"CMAKE_MAKE_PROGRAM","");
    pcVar10 = cmMakefile::GetRequiredDefinition(pcVar25,(string *)local_410);
    std::__cxx11::string::string((string *)local_310,pcVar10,(allocator *)&local_430);
    if ((char *)local_410._0_8_ != pcVar9) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"yes\" ?>\n<CodeBlocks_project_file>\n   <FileVersion major=\"1\" minor=\"6\" />\n   <Project>\n      <Option title=\""
               ,0x9c);
    cmLocalGenerator::GetProjectName_abi_cxx11_
              ((string *)local_410,
               *(pvVar27->
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl
                .super__Vector_impl_data._M_start);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_278,(char *)local_410._0_8_,local_410._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"\" />\n      <Option makefile_is_custom=\"1\" />\n      <Option compiler=\""
               ,0x45);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,(char *)local_3c8._0_8_,local_3c8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" />\n      ",0xb);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,local_370._M_dataplus._M_p,local_370._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n      <Build>\n",0xf);
    pcVar23 = local_3e0;
    if ((char *)local_410._0_8_ != pcVar9) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
    local_410._0_8_ = pcVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"all","");
    AppendTarget(pcVar23,(cmGeneratedFileStream *)local_278,(string *)local_410,
                 (cmGeneratorTarget *)0x0,(char *)local_310[0],
                 *(pvVar27->
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                  _M_impl.super__Vector_impl_data._M_start,(char *)local_3c8._0_8_);
    if ((char *)local_410._0_8_ != pcVar9) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
    ppcVar20 = (pvVar27->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    if (ppcVar20 !=
        (pvVar27->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                  ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_450,
                   &(*ppcVar20)->GeneratorTargets);
        for (_Var26._M_p = local_450._M_dataplus._M_p;
            _Var26._M_p != (pointer)local_450._M_string_length; _Var26._M_p = _Var26._M_p + 8) {
          psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(*(cmGeneratorTarget **)_Var26._M_p);
          pcVar3 = (psVar15->_M_dataplus)._M_p;
          local_410._0_8_ = pcVar9;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_410,pcVar3,pcVar3 + psVar15->_M_string_length);
          TVar7 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)_Var26._M_p);
          if (TVar7 < UTILITY) {
            pcVar4 = *(cmGeneratorTarget **)_Var26._M_p;
            AppendTarget(local_3e0,(cmGeneratedFileStream *)local_278,(string *)local_410,pcVar4,
                         (char *)local_310[0],*ppcVar20,(char *)local_3c8._0_8_);
            local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_430,local_410._0_8_,
                       (char *)(local_410._0_8_ + local_410._8_8_));
            std::__cxx11::string::append((char *)&local_430);
            AppendTarget(local_3e0,(cmGeneratedFileStream *)local_278,&local_430,pcVar4,
                         (char *)local_310[0],*ppcVar20,(char *)local_3c8._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_430._M_dataplus._M_p != &local_430.field_2) {
              operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else if (TVar7 == UTILITY) {
            lVar11 = std::__cxx11::string::find((char *)local_410,0x59bf25,0);
            if (((lVar11 != 0) ||
                (iVar8 = std::__cxx11::string::compare((char *)local_410), iVar8 == 0)) &&
               ((lVar11 = std::__cxx11::string::find((char *)local_410,0x59be21,0), lVar11 != 0 ||
                (iVar8 = std::__cxx11::string::compare((char *)local_410), iVar8 == 0)))) {
              lVar11 = std::__cxx11::string::find((char *)local_410,0x59bea0,0);
              if (lVar11 == 0) {
                iVar8 = std::__cxx11::string::compare((char *)local_410);
                goto LAB_0042af22;
              }
LAB_0042af7d:
              AppendTarget(local_3e0,(cmGeneratedFileStream *)local_278,(string *)local_410,
                           (cmGeneratorTarget *)0x0,(char *)local_310[0],*ppcVar20,
                           (char *)local_3c8._0_8_);
            }
          }
          else if (TVar7 == GLOBAL_TARGET) {
            pcVar10 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar20);
            __s2 = cmLocalGenerator::GetBinaryDirectory(*ppcVar20);
            iVar8 = strcmp(pcVar10,__s2);
LAB_0042af22:
            if (iVar8 == 0) goto LAB_0042af7d;
          }
          if ((char *)local_410._0_8_ != pcVar9) {
            operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_450._M_dataplus._M_p,
                          local_450.field_2._M_allocated_capacity - (long)local_450._M_dataplus._M_p
                         );
        }
        ppcVar20 = ppcVar20 + 1;
        pcVar23 = local_3e0;
        pvVar27 = local_350;
      } while (ppcVar20 !=
               (local_350->
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"      </Build>\n",0xf);
    local_410._24_8_ = local_410 + 8;
    local_410._8_8_ = local_410._8_8_ & 0xffffffff00000000;
    local_410._16_8_ = 0;
    local_3e8 = 0;
    local_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_328.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_3f0 = (_Rb_tree_node_base *)local_410._24_8_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2e0,
             &((pcVar23->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance->
              SourceFileExtensions);
    ppcVar20 = (pvVar27->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    if (ppcVar20 !=
        (pvVar27->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_2e8 = (*ppcVar20)->Makefile;
        local_2f0 = ppcVar20;
        std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                  ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_388,
                   &(*ppcVar20)->GeneratorTargets);
        uVar16 = local_388._M_allocated_capacity;
        while( true ) {
          if (uVar16 == local_388._8_8_) break;
          local_3d0 = (cmMakefile *)uVar16;
          TVar7 = cmGeneratorTarget::GetType
                            (*(cmGeneratorTarget **)
                              &(((cmMakefile *)uVar16)->CMP0054ReportedIds)._M_t._M_impl);
          if (TVar7 < GLOBAL_TARGET) {
            local_348.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_348.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_348.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pcVar4 = *(cmGeneratorTarget **)&(local_3d0->CMP0054ReportedIds)._M_t._M_impl;
            local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_450,"CMAKE_BUILD_TYPE","");
            pcVar9 = cmMakefile::GetSafeDefinition(local_2e8,&local_450);
            std::__cxx11::string::string((string *)&local_430,pcVar9,&local_3d1);
            cmGeneratorTarget::GetSourceFiles(pcVar4,&local_348,&local_430);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_430._M_dataplus._M_p != &local_430.field_2) {
              operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1
                             );
            }
            ppcVar22 = local_348.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_450._M_dataplus._M_p != &local_450.field_2) {
              operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1
                             );
              ppcVar22 = local_348.
                         super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
            }
            while( true ) {
              if (ppcVar22 ==
                  local_348.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish) break;
              this_00 = *ppcVar22;
              local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"GENERATED","");
              bVar6 = cmSourceFile::GetPropertyAsBool(this_00,&local_430);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_430._M_dataplus._M_p != &local_430.field_2) {
                operator_delete(local_430._M_dataplus._M_p,
                                local_430.field_2._M_allocated_capacity + 1);
              }
              if (!bVar6) {
                cmSourceFile::GetLanguage_abi_cxx11_(&local_430,*ppcVar22);
                iVar8 = std::__cxx11::string::compare((char *)&local_430);
                if ((iVar8 == 0) ||
                   (iVar8 = std::__cxx11::string::compare((char *)&local_430), iVar8 == 0)) {
                  psVar15 = cmSourceFile::GetExtension_abi_cxx11_(*ppcVar22);
                  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
                  pcVar3 = (psVar15->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_450,pcVar3,pcVar3 + psVar15->_M_string_length);
                  pbVar5 = local_2e0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  __n = local_450._M_string_length;
                  _Var26._M_p = local_450._M_dataplus._M_p;
                  pbVar24 = local_2e0.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  while ((bVar6 = pbVar24 != pbVar5, bVar6 &&
                         (((undefined8 *)__n != (undefined8 *)pbVar24->_M_string_length ||
                          (((undefined8 *)__n != (undefined8 *)0x0 &&
                           (iVar8 = bcmp(_Var26._M_p,(pbVar24->_M_dataplus)._M_p,__n), iVar8 != 0)))
                          )))) {
                    pbVar24 = pbVar24 + 1;
                  }
                  pvVar27 = local_350;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_450._M_dataplus._M_p != &local_450.field_2) {
                    operator_delete(local_450._M_dataplus._M_p,
                                    local_450.field_2._M_allocated_capacity + 1);
                    pvVar27 = local_350;
                  }
                }
                else {
                  bVar6 = false;
                }
                psVar15 = cmSourceFile::GetFullPath(*ppcVar22,(string *)0x0);
                local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
                pcVar3 = (psVar15->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_450,pcVar3,pcVar3 + psVar15->_M_string_length);
                if (bVar6) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&local_328,&local_450);
                }
                this_02 = (vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                           *)std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                           *)local_410,&local_450);
                __position._M_current = *(cmGeneratorTarget ***)(this_02 + 8);
                if (__position._M_current == *(cmGeneratorTarget ***)(this_02 + 0x10)) {
                  std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
                  _M_realloc_insert<cmGeneratorTarget_const*const&>
                            (this_02,__position,(cmGeneratorTarget **)local_3d0);
                }
                else {
                  *__position._M_current =
                       *(cmGeneratorTarget **)&(local_3d0->CMP0054ReportedIds)._M_t._M_impl;
                  *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_450._M_dataplus._M_p != &local_450.field_2) {
                  operator_delete(local_450._M_dataplus._M_p,
                                  local_450.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_430._M_dataplus._M_p != &local_430.field_2) {
                  operator_delete(local_430._M_dataplus._M_p,
                                  local_430.field_2._M_allocated_capacity + 1);
                }
              }
              ppcVar22 = ppcVar22 + 1;
            }
            pcVar23 = local_3e0;
            if (local_348.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_348.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_348.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_348.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
              pcVar23 = local_3e0;
            }
          }
          uVar16 = &(local_3d0->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header;
        }
        if ((cmMakefile *)local_388._M_allocated_capacity != (cmMakefile *)0x0) {
          operator_delete((void *)local_388._M_allocated_capacity,local_378 - local_388._0_8_);
        }
        ppcVar20 = local_2f0 + 1;
      } while (ppcVar20 !=
               (pvVar27->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_388,
             &((pcVar23->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance->
              HeaderFileExtensions);
    if (local_328.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_328.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      paVar1 = &local_450.field_2;
      pbVar24 = local_328.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmsys::SystemTools::GetFilenamePath(&local_430,pbVar24);
        std::__cxx11::string::append((char *)&local_430);
        cmsys::SystemTools::GetFilenameWithoutExtension(&local_450,pbVar24);
        std::__cxx11::string::_M_append((char *)&local_430,(ulong)local_450._M_dataplus._M_p);
        uVar16 = local_388._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != paVar1) {
          operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
          uVar16 = local_388._M_allocated_capacity;
        }
        for (; uVar16 != local_388._8_8_;
            uVar16 = &(((cmMakefile *)uVar16)->CMP0054ReportedIds)._M_t._M_impl.
                      super__Rb_tree_header._M_header._M_right) {
          local_450._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_450,local_430._M_dataplus._M_p,
                     local_430._M_dataplus._M_p + local_430._M_string_length);
          std::__cxx11::string::append((char *)&local_450);
          std::__cxx11::string::_M_append
                    ((char *)&local_450,
                     *(ulong *)&(((cmMakefile *)uVar16)->CMP0054ReportedIds)._M_t._M_impl);
          iVar17 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                           *)local_410,&local_450);
          if (iVar17._M_node != (_Base_ptr)(local_410 + 8)) {
LAB_0042b56d:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_450._M_dataplus._M_p != paVar1) {
              operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1
                             );
            }
            break;
          }
          bVar6 = cmsys::SystemTools::FileExists(local_450._M_dataplus._M_p);
          if (bVar6) {
            __x = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                *)local_410,pbVar24);
            this_03 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                    *)local_410,&local_450);
            std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            operator=(&this_03->Targets,&__x->Targets);
            goto LAB_0042b56d;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_450._M_dataplus._M_p != paVar1) {
            operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != &local_430.field_2) {
          operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
        }
        pbVar24 = pbVar24 + 1;
      } while (pbVar24 !=
               local_328.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((_Rb_tree_node_base *)local_410._24_8_ != (_Rb_tree_node_base *)(local_410 + 8)) {
      p_Var18 = (_Rb_tree_node_base *)local_410._24_8_;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"      <Unit filename=\"",0x16);
        cmXMLSafe::cmXMLSafe((cmXMLSafe *)&local_430,(string *)(p_Var18 + 1));
        poVar14 = operator<<((ostream *)local_278,(cmXMLSafe *)&local_430);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\">\n",3);
        for (p_Var12 = *(_Base_ptr *)(p_Var18 + 2); p_Var12 != p_Var18[2]._M_parent;
            p_Var12 = (_Base_ptr)&p_Var12->_M_parent) {
          psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(*(cmGeneratorTarget **)p_Var12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,"         <Option target=\"",0x19);
          cmXMLSafe::cmXMLSafe((cmXMLSafe *)&local_430,psVar15);
          poVar14 = operator<<((ostream *)local_278,(cmXMLSafe *)&local_430);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\"/>\n",4);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"      </Unit>\n",0xe);
        p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
      } while (p_Var18 != (_Rb_tree_node_base *)(local_410 + 8));
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,(char *)local_3a8._M_allocated_capacity,local_3a8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"   </Project>\n</CodeBlocks_project_file>\n",0x29);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_388);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_328);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                 *)local_410);
    if (local_310[0] != local_300) {
      operator_delete(local_310[0],local_300[0] + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_3c8 + 0x10)) {
      operator_delete((void *)local_3c8._0_8_,(ulong)(local_3c8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_allocated_capacity != &local_398) {
      operator_delete((void *)local_3a8._M_allocated_capacity,local_398._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,
                      CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                               local_370.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2c8.files);
    std::vector<Tree,_std::allocator<Tree>_>::~vector(&local_2c8.folders);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8.path._M_dataplus._M_p != &local_2c8.path.field_2) {
      operator_delete(local_2c8.path._M_dataplus._M_p,
                      CONCAT71(local_2c8.path.field_2._M_allocated_capacity._1_7_,
                               local_2c8.path.field_2._M_local_buf[0]) + 1);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator
  ::CreateNewProjectFile(const std::vector<cmLocalGenerator*>& lgs,
                         const std::string& filename)
{
  const cmMakefile* mf=lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename.c_str());
  if(!fout)
    {
    return;
    }

  Tree tree;

  // build tree of virtual folders
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
          it = this->GlobalGenerator->GetProjectMap().begin();
         it != this->GlobalGenerator->GetProjectMap().end();
         ++it)
    {
    // Collect all files
    std::vector<std::string> listFiles;
    for (std::vector<cmLocalGenerator *>::const_iterator
         jt = it->second.begin();
         jt != it->second.end();
         ++jt)
      {
      const std::vector<std::string> & files =
                                          (*jt)->GetMakefile()->GetListFiles();
      listFiles.insert(listFiles.end(), files.begin(), files.end());
      }

    // Convert
    const char* cmakeRoot = mf->GetDefinition("CMAKE_ROOT");
    for (std::vector<std::string>::const_iterator jt = listFiles.begin();
         jt != listFiles.end();
         ++jt)
      {
      // don't put cmake's own files into the project (#12110):
      if (jt->find(cmakeRoot) == 0)
        {
        continue;
        }

      const std::string &relative = cmSystemTools::RelativePath(
                         it->second[0]->GetSourceDirectory(),
                         jt->c_str());
      std::vector<std::string> splitted;
      cmSystemTools::SplitPath(relative, splitted, false);
      // Split filename from path
      std::string fileName = *(splitted.end()-1);
      splitted.erase(splitted.end() - 1, splitted.end());

      // We don't want paths with CMakeFiles in them
      // or do we?
      // In speedcrunch those where purely internal
      if (splitted.size() >= 1
          && relative.find("CMakeFiles") == std::string::npos)
        {
        tree.InsertPath(splitted, 1, fileName);
        }
      }
    }

  // Now build a virtual tree string
  std::string virtualFolders;
  tree.BuildVirtualFolder(virtualFolders);
  // And one for <Unit>
  std::string unitFiles;
  tree.BuildUnit(unitFiles, std::string(lgs[0]->GetSourceDirectory()) + "/");

  // figure out the compiler
  std::string compiler = this->GetCBCompilerId(mf);
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");

  fout<<"<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"yes\" ?>\n"
        "<CodeBlocks_project_file>\n"
        "   <FileVersion major=\"1\" minor=\"6\" />\n"
        "   <Project>\n"
        "      <Option title=\"" << lgs[0]->GetProjectName()<<"\" />\n"
        "      <Option makefile_is_custom=\"1\" />\n"
        "      <Option compiler=\"" << compiler << "\" />\n"
        "      "<<virtualFolders<<"\n"
        "      <Build>\n";

  this->AppendTarget(fout, "all", 0, make.c_str(), lgs[0], compiler.c_str());

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    std::vector<cmGeneratorTarget*> targets=(*lg)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      std::string targetName = (*ti)->GetName();
      switch((*ti)->GetType())
        {
        case cmState::GLOBAL_TARGET:
          {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (strcmp((*lg)->GetCurrentBinaryDirectory(),
                     (*lg)->GetBinaryDirectory())==0)
            {
            this->AppendTarget(fout, targetName, 0,
                               make.c_str(), *lg, compiler.c_str());
            }
          }
          break;
        case cmState::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly")==0)   &&(targetName!="Nightly"))
             || ((targetName.find("Continuous")==0)
                 &&(targetName!="Continuous"))
             || ((targetName.find("Experimental")==0)
                                             && (targetName!="Experimental")))
            {
            break;
            }

          this->AppendTarget(fout, targetName, 0,
                                 make.c_str(), *lg, compiler.c_str());
          break;
        case cmState::EXECUTABLE:
        case cmState::STATIC_LIBRARY:
        case cmState::SHARED_LIBRARY:
        case cmState::MODULE_LIBRARY:
        case cmState::OBJECT_LIBRARY:
          {
          cmGeneratorTarget* gt = *ti;
          this->AppendTarget(fout, targetName, gt,
                             make.c_str(), *lg, compiler.c_str());
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, gt,
                             make.c_str(), *lg, compiler.c_str());
          }
          break;
        default:
          break;
        }
      }
    }

  fout<<"      </Build>\n";


  // Collect all used source files in the project.
  // Keep a list of C/C++ source files which might have an acompanying header
  // that should be looked for.
  typedef std::map<std::string, CbpUnit> all_files_map_t;
  all_files_map_t allFiles;
  std::vector<std::string> cFiles;

  std::vector<std::string> srcExts =
      this->GlobalGenerator->GetCMakeInstance()->GetSourceExtensions();

  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    cmMakefile* makefile=(*lg)->GetMakefile();
    std::vector<cmGeneratorTarget*> targets=(*lg)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      switch((*ti)->GetType())
        {
        case cmState::EXECUTABLE:
        case cmState::STATIC_LIBRARY:
        case cmState::SHARED_LIBRARY:
        case cmState::MODULE_LIBRARY:
        case cmState::OBJECT_LIBRARY:
        case cmState::UTILITY: // can have sources since 2.6.3
          {
          std::vector<cmSourceFile*> sources;
          cmGeneratorTarget* gt = *ti;
          gt->GetSourceFiles(sources,
                            makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (std::vector<cmSourceFile*>::const_iterator si=sources.begin();
               si!=sources.end(); si++)
            {
            // don't add source files which have the GENERATED property set:
            if ((*si)->GetPropertyAsBool("GENERATED"))
              {
              continue;
              }

            // check whether it is a C/C++ implementation file
            bool isCFile = false;
            std::string lang = (*si)->GetLanguage();
            if (lang == "C" || lang == "CXX")
              {
              std::string srcext = (*si)->GetExtension();
              for(std::vector<std::string>::const_iterator
                  ext = srcExts.begin(); ext != srcExts.end(); ++ext)
                {
                if (srcext == *ext)
                  {
                  isCFile = true;
                  break;
                  }
                }
              }

            std::string fullPath = (*si)->GetFullPath();

            if(isCFile)
              {
              cFiles.push_back(fullPath);
              }

            CbpUnit &cbpUnit = allFiles[fullPath];
            cbpUnit.Targets.push_back(*ti);
            }
          }
        default:  // intended fallthrough
          break;
        }
      }
    }

  std::vector<std::string> headerExts =
      this->GlobalGenerator->GetCMakeInstance()->GetHeaderExtensions();

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all
  // C/C++ source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the kdevelop
  // project generator.
  for (std::vector<std::string>::const_iterator
       sit=cFiles.begin();
       sit!=cFiles.end();
       ++sit)
    {
    std::string const& fileName = *sit;
    std::string headerBasename=cmSystemTools::GetFilenamePath(fileName);
    headerBasename+="/";
    headerBasename+=cmSystemTools::GetFilenameWithoutExtension(fileName);

    // check if there's a matching header around
    for(std::vector<std::string>::const_iterator
        ext = headerExts.begin();
        ext != headerExts.end();
        ++ext)
      {
      std::string hname=headerBasename;
      hname += ".";
      hname += *ext;
      // if it's already in the set, don't check if it exists on disk
      if (allFiles.find(hname) != allFiles.end())
        {
        break;
        }

      if(cmSystemTools::FileExists(hname.c_str()))
        {
        allFiles[hname].Targets = allFiles[fileName].Targets;
        break;
        }
      }
    }

  // insert all source files in the CodeBlocks project
  for (all_files_map_t::const_iterator
       sit=allFiles.begin();
       sit!=allFiles.end();
       ++sit)
    {
    std::string const& unitFilename = sit->first;
    CbpUnit const& unit = sit->second;

    fout<<"      <Unit filename=\""<< cmXMLSafe(unitFilename) <<"\">\n";

    for(std::vector<const cmGeneratorTarget*>::const_iterator ti =
        unit.Targets.begin();
        ti != unit.Targets.end(); ++ti)
      {
      std::string const& targetName = (*ti)->GetName();
      fout<<"         <Option target=\""<< cmXMLSafe(targetName) <<"\"/>\n";
      }

    fout<<"      </Unit>\n";
    }

  // Add CMakeLists.txt
  fout<<unitFiles;

  fout<<"   </Project>\n"
        "</CodeBlocks_project_file>\n";
}